

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O1

void __thiscall ADynamicLight::UnlinkLight(ADynamicLight *this)

{
  uint uVar1;
  AActor *pAVar2;
  TObjPtr<AActor> *pTVar3;
  int iVar4;
  int iVar5;
  FLightNode *pFVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar9;
  uint uVar10;
  
  if ((this->owned == true) &&
     (pAVar2 = (this->super_AActor).target.field_0.p, pAVar2 != (AActor *)0x0)) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      uVar10 = (((this->super_AActor).target.field_0.p)->dynamiclights).Count;
      iVar4 = uVar10 + 1;
      uVar7 = (ulong)uVar10;
      do {
        uVar8 = uVar7;
        iVar5 = iVar4;
        uVar7 = uVar8 - 1;
        if (iVar5 + -2 < 0) goto LAB_00374f3d;
        uVar10 = (uint)uVar7 & 0x7fffffff;
        pTVar3 = (((this->super_AActor).target.field_0.p)->dynamiclights).Array;
        aVar9 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)pTVar3[uVar10].field_0.p;
        if ((aVar9 != (AActor *)0x0) &&
           (((((AActor *)&(aVar9.p)->super_DThinker)->super_DThinker).super_DObject.ObjectFlags &
            0x20) != 0)) {
          pTVar3[uVar10].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
          aVar9.p = (AActor *)0x0;
        }
        iVar4 = iVar5 + -1;
      } while ((ADynamicLight *)aVar9.p != this);
      pAVar2 = (this->super_AActor).target.field_0.p;
      uVar1 = (pAVar2->dynamiclights).Count;
      if ((iVar5 - 2U < uVar1) &&
         ((pAVar2->dynamiclights).Count = uVar1 - 1, iVar5 - 2U < uVar1 - 1)) {
        pTVar3 = (pAVar2->dynamiclights).Array;
        memmove(pTVar3 + uVar10,pTVar3 + uVar8,(ulong)(uVar1 - (iVar5 + -1)) << 3);
      }
    }
    else {
      (this->super_AActor).target.field_0.p = (AActor *)0x0;
    }
  }
LAB_00374f3d:
  pFVar6 = this->touching_sides;
  while (pFVar6 != (FLightNode *)0x0) {
    pFVar6 = DeleteLightNode(pFVar6);
    this->touching_sides = pFVar6;
  }
  pFVar6 = this->touching_subsectors;
  while (pFVar6 != (FLightNode *)0x0) {
    pFVar6 = DeleteLightNode(pFVar6);
    this->touching_subsectors = pFVar6;
  }
  pFVar6 = this->touching_sector;
  while (pFVar6 != (FLightNode *)0x0) {
    pFVar6 = DeleteLightNode(pFVar6);
    this->touching_sector = pFVar6;
  }
  return;
}

Assistant:

void ADynamicLight::UnlinkLight ()
{
	if (owned && target != NULL)
	{
		// Delete reference in owning actor
		for(int c=target->dynamiclights.Size()-1; c>=0; c--)
		{
			if (target->dynamiclights[c] == this)
			{
				target->dynamiclights.Delete(c);
				break;
			}
		}
	}
	while (touching_sides) touching_sides = DeleteLightNode(touching_sides);
	while (touching_subsectors) touching_subsectors = DeleteLightNode(touching_subsectors);
	while (touching_sector) touching_sector = DeleteLightNode(touching_sector);
}